

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app_dummy.cpp
# Opt level: O1

bool __thiscall
ot::commissioner::CommissionerApp::OnJoinerFinalize
          (CommissionerApp *this,ByteArray *aJoinerId,string *aVendorName,string *aVendorModel,
          string *aVendorSwVersion,ByteArray *aVendorStackVersion,string *aProvisioningUrl,
          ByteArray *aVendorData)

{
  return false;
}

Assistant:

bool CommissionerApp::OnJoinerFinalize(const ByteArray   &aJoinerId,
                                       const std::string &aVendorName,
                                       const std::string &aVendorModel,
                                       const std::string &aVendorSwVersion,
                                       const ByteArray   &aVendorStackVersion,
                                       const std::string &aProvisioningUrl,
                                       const ByteArray   &aVendorData)
{
    UNUSED(aJoinerId);
    UNUSED(aVendorName);
    UNUSED(aVendorData);
    UNUSED(aVendorModel);
    UNUSED(aVendorSwVersion);
    UNUSED(aVendorStackVersion);
    UNUSED(aProvisioningUrl);
    UNUSED(aVendorData);

    return false;
}